

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.h
# Opt level: O0

void __thiscall vm_bif_entry_t::link_to_image(vm_bif_entry_t *this,ushort set_idx)

{
  ushort in_SI;
  long in_RDI;
  ushort i;
  undefined4 in_stack_fffffffffffffff0;
  ushort func_idx;
  
  (**(code **)(in_RDI + 0x18))();
  for (func_idx = 0; (ulong)func_idx < *(ulong *)(in_RDI + 8); func_idx = func_idx + 1) {
    vm_val_t::set_bifptr
              ((vm_val_t *)(*(long *)(in_RDI + 0x10) + (ulong)func_idx * 0x38 + 0x18),in_SI,func_idx
              );
    vm_bif_desc::init_synth_hdr
              ((vm_bif_desc *)CONCAT26(in_SI,CONCAT24(func_idx,in_stack_fffffffffffffff0)));
  }
  return;
}

Assistant:

void link_to_image(VMG_ ushort set_idx)
    {
        /* initialize the function set */
        (*attach)(vmg0_);

        /* link each function entry */
        for (ushort i = 0 ; i < func_count ; ++i)
        {
            /* set up the bifptr value for the function */
            func[i].bifptr.set_bifptr(set_idx, i);

            /* generate the synthetic method header for the function */
            func[i].init_synth_hdr();
        }
    }